

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O0

void __thiscall Clasp::BasicSatConfig::BasicSatConfig(BasicSatConfig *this)

{
  undefined8 *in_RDI;
  SolverParams *in_stack_ffffffffffffff30;
  SolveParams *x;
  pod_vector<Clasp::SolveParams,_std::allocator<Clasp::SolveParams>_> *ppVar1;
  
  UserConfiguration::UserConfiguration((UserConfiguration *)in_stack_ffffffffffffff30);
  ContextParams::ContextParams((ContextParams *)in_stack_ffffffffffffff30);
  *in_RDI = &PTR__BasicSatConfig_002deba8;
  ppVar1 = (pod_vector<Clasp::SolveParams,_std::allocator<Clasp::SolveParams>_> *)(in_RDI + 3);
  bk_lib::pod_vector<Clasp::SolverParams,_std::allocator<Clasp::SolverParams>_>::pod_vector
            ((pod_vector<Clasp::SolverParams,_std::allocator<Clasp::SolverParams>_> *)ppVar1);
  bk_lib::pod_vector<Clasp::SolveParams,_std::allocator<Clasp::SolveParams>_>::pod_vector(ppVar1);
  ppVar1 = (pod_vector<Clasp::SolveParams,_std::allocator<Clasp::SolveParams>_> *)(in_RDI + 7);
  SingleOwnerPtr<Clasp::BasicSatConfig::HeuristicCreator,_Clasp::DeleteObject>::SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::BasicSatConfig::HeuristicCreator,_Clasp::DeleteObject> *)ppVar1)
  ;
  x = (SolveParams *)(in_RDI + 3);
  SolverParams::SolverParams(in_stack_ffffffffffffff30);
  bk_lib::pod_vector<Clasp::SolverParams,_std::allocator<Clasp::SolverParams>_>::push_back
            ((pod_vector<Clasp::SolverParams,_std::allocator<Clasp::SolverParams>_> *)ppVar1,
             (SolverParams *)x);
  SolveParams::SolveParams((SolveParams *)(in_RDI + 5));
  bk_lib::pod_vector<Clasp::SolveParams,_std::allocator<Clasp::SolveParams>_>::push_back(ppVar1,x);
  return;
}

Assistant:

BasicSatConfig::BasicSatConfig() {
	solver_.push_back(SolverParams());
	search_.push_back(SolveParams());
}